

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_string_ops.hpp
# Opt level: O3

vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
* __thiscall
gmlc::utilities::
generalized_string_split<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
          (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           *__return_storage_ptr__,utilities *this,
          basic_string_view<char,_std::char_traits<char>_> *str,
          basic_string_view<char,_std::char_traits<char>_> *delimiterCharacters,bool compress)

{
  pointer *ppbVar1;
  size_t sVar2;
  char *pcVar3;
  size_type __rlen;
  size_type sVar4;
  ulong uVar5;
  ulong uVar6;
  iterator iVar7;
  ulong __pos;
  undefined4 uVar8;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __pos = 0;
  sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                    ((basic_string_view<char,_std::char_traits<char>_> *)this,str->_M_str,0,
                     str->_M_len);
  if (sVar4 != 0xffffffffffffffff) {
    __pos = 0;
    do {
      uVar5 = sVar4 - __pos;
      if (uVar5 == 0) {
        if ((char)delimiterCharacters == '\0') {
          local_48._M_len._0_4_ = 0;
          local_48._M_len = 0;
          local_48._M_str = (char *)0x0;
          iVar7._M_current =
               (__return_storage_ptr__->
               super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          uVar8 = 0;
          uVar5 = local_48._M_len;
          if (iVar7._M_current !=
              (__return_storage_ptr__->
              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_003d5fcf;
          std::
          vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
          ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>>
                    ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                      *)__return_storage_ptr__,iVar7,&local_48);
        }
      }
      else {
        uVar6 = *(ulong *)this - __pos;
        if (*(ulong *)this < __pos) {
          std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                     __pos);
        }
        if (uVar6 < uVar5) {
          uVar5 = uVar6;
        }
        local_48._M_str = (char *)(__pos + *(long *)(this + 8));
        iVar7._M_current =
             (__return_storage_ptr__->
             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar7._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          local_48._M_len = uVar5;
          std::
          vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
          ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>>
                    ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                      *)__return_storage_ptr__,iVar7,&local_48);
        }
        else {
          local_48._M_len._0_4_ = (undefined4)uVar5;
          local_48._M_len._4_4_ = (undefined4)(uVar5 >> 0x20);
          uVar8 = local_48._M_len._4_4_;
LAB_003d5fcf:
          local_48._M_len = uVar5;
          *(undefined4 *)&(iVar7._M_current)->_M_len = (undefined4)local_48._M_len;
          *(undefined4 *)((long)&(iVar7._M_current)->_M_len + 4) = uVar8;
          (iVar7._M_current)->_M_str = local_48._M_str;
          ppbVar1 = &(__return_storage_ptr__->
                     super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppbVar1 = *ppbVar1 + 1;
        }
      }
      __pos = sVar4 + 1;
      sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                        ((basic_string_view<char,_std::char_traits<char>_> *)this,str->_M_str,__pos,
                         str->_M_len);
    } while (sVar4 != 0xffffffffffffffff);
  }
  local_48._M_len = *(ulong *)this - __pos;
  if (*(ulong *)this < __pos || local_48._M_len == 0) {
    if ((char)delimiterCharacters != '\0') {
      return __return_storage_ptr__;
    }
    local_48._M_len = 0;
    local_48._M_str = (char *)0x0;
    iVar7._M_current =
         (__return_storage_ptr__->
         super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    sVar2 = 0;
    pcVar3 = (char *)0x0;
    if (iVar7._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>>
                ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                  *)__return_storage_ptr__,iVar7,&local_48);
      return __return_storage_ptr__;
    }
  }
  else {
    local_48._M_str = (char *)(__pos + *(long *)(this + 8));
    iVar7._M_current =
         (__return_storage_ptr__->
         super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    sVar2 = local_48._M_len;
    pcVar3 = local_48._M_str;
    if (iVar7._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>>
                ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                  *)__return_storage_ptr__,iVar7,&local_48);
      return __return_storage_ptr__;
    }
  }
  (iVar7._M_current)->_M_len = sVar2;
  (iVar7._M_current)->_M_str = pcVar3;
  ppbVar1 = &(__return_storage_ptr__->
             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  *ppbVar1 = *ppbVar1 + 1;
  return __return_storage_ptr__;
}

Assistant:

std::vector<XO> generalized_string_split(
    const X& str,
    const X& delimiterCharacters,
    bool compress)
{
    std::vector<XO> ret;

    auto pos = str.find_first_of(delimiterCharacters);
    decltype(pos) start = 0;
    while (pos != X::npos) {
        if (pos != start) {
            ret.emplace_back(str.substr(start, pos - start));
        } else if (!compress) {
            ret.push_back(XO());
        }
        start = pos + 1;
        pos = str.find_first_of(delimiterCharacters, start);
    }
    if (start < str.length()) {
        ret.emplace_back(str.substr(start));
    } else if (!compress) {
        ret.push_back(XO());
    }
    return ret;
}